

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProvider.cpp
# Opt level: O1

char __thiscall TextProviderString::advance(TextProviderString *this)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  _Storage<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Var4;
  element_type *peVar5;
  uint __val;
  uint uVar6;
  char cVar7;
  int iVar8;
  long *plVar9;
  uint uVar10;
  long *plVar11;
  ulong uVar12;
  undefined1 uVar13;
  uint __len;
  long lVar14;
  string __str;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  bVar2 = (this->m_iterator).
          super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_engaged;
  if (bVar2 == false) {
    (this->m_iterator).
    super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload = (_Storage<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                   )(this->m_text)._M_dataplus._M_p;
    (this->m_iterator).
    super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_engaged = true;
  }
  iVar8 = (*(this->super_TextProvider)._vptr_TextProvider[2])(this);
  if ((char)iVar8 == '\0') {
    lVar14 = 0x20;
    uVar13 = 0;
  }
  else {
    piVar1 = &(this->super_TextProvider).m_current_char_idx;
    *piVar1 = *piVar1 + 1;
    if (bVar2 != false) {
      if ((this->m_iterator).
          super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_engaged == false) goto LAB_0014b0e0;
      (this->m_iterator).
      super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_payload = (_Storage<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     )((long)(this->m_iterator).
                             super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_payload + 1);
    }
    if ((this->m_iterator).
        super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_engaged == false) {
LAB_0014b0e0:
      std::__throw_bad_optional_access();
    }
    _Var4 = (this->m_iterator).
            super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_payload;
    if (_Var4 == (_Storage<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  )((this->m_text)._M_dataplus._M_p + (this->m_text)._M_string_length)) {
      cVar7 = '\0';
    }
    else {
      cVar7 = *(char *)_Var4;
    }
    (this->super_TextProvider).m_current_char = cVar7;
    if (-1 < cVar7) goto LAB_0014aec6;
    peVar5 = (this->super_TextProvider).m_logger.
             super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,
               TextProvider::m_parser_text_provider_log_cat_abi_cxx11_._M_dataplus._M_p,
               TextProvider::m_parser_text_provider_log_cat_abi_cxx11_._M_dataplus._M_p +
               TextProvider::m_parser_text_provider_log_cat_abi_cxx11_._M_string_length);
    uVar3 = (this->super_TextProvider).m_current_char_idx;
    __val = -uVar3;
    if (0 < (int)uVar3) {
      __val = uVar3;
    }
    __len = 1;
    if (9 < __val) {
      uVar12 = (ulong)__val;
      uVar6 = 4;
      do {
        __len = uVar6;
        uVar10 = (uint)uVar12;
        if (uVar10 < 100) {
          __len = __len - 2;
          goto LAB_0014af64;
        }
        if (uVar10 < 1000) {
          __len = __len - 1;
          goto LAB_0014af64;
        }
        if (uVar10 < 10000) goto LAB_0014af64;
        uVar12 = uVar12 / 10000;
        uVar6 = __len + 4;
      } while (99999 < uVar10);
      __len = __len + 1;
    }
LAB_0014af64:
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct((ulong)local_b0,(char)__len - (char)((int)uVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_b0[0]),__len,__val);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x14ef60);
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      local_60 = *plVar11;
      lStack_58 = plVar9[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar11;
      local_70 = (long *)*plVar9;
    }
    local_68 = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      local_40 = *plVar11;
      uStack_38 = (undefined4)plVar9[3];
      uStack_34 = *(undefined4 *)((long)plVar9 + 0x1c);
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar11;
      local_50 = (long *)*plVar9;
    }
    local_48 = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    (*peVar5->_vptr_PSLogger[2])(peVar5,4,local_90);
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
    lVar14 = 0x18;
    uVar13 = 1;
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
      uVar13 = 1;
    }
  }
  *(undefined1 *)((long)&(this->super_TextProvider)._vptr_TextProvider + lVar14) = uVar13;
LAB_0014aec6:
  return (this->super_TextProvider).m_current_char;
}

Assistant:

char TextProviderString::advance()
{
	//todo this is probably the wrong way to deal with the fact that contrary to the "get" method on the file, the iterator already points to a valid char if the text is not empty but I'm too tired so this'll work for now.
	//todo it's ugly though and it makes "peek" unusable before "advance". Also, using "reverse" until the beggining of the string would mess it all
	bool avoid_iterator_increment = false;

	if(!m_iterator.has_value())
	{
		m_iterator = m_text.begin();
		avoid_iterator_increment = true;
	}

	if(is_valid())
	{
		++m_current_char_idx;

		if(!avoid_iterator_increment)
		{
			++m_iterator.value();
		}

		if(m_iterator.value() != m_text.end())
		{
			m_current_char = *m_iterator.value();
		}
		else
		{
			m_current_char = '\0';
		}

		if( static_cast<unsigned char>(m_current_char) > 127)
		{
			m_logger->log(PSLogger::LogType::Error, m_parser_text_provider_log_cat,
			"detected non ascii character ( n : "+to_string(m_current_char_idx)+". this interpreter does not yet support unicode files, sorry :/");
			//todo add a line counter in this class to make these function return the correct line
			m_has_error = true;
		}
	}
	else
	{
		m_current_char = '\0';
	}
	return m_current_char;
}